

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaseDecisionDag.h
# Opt level: O3

void __thiscall slang::analysis::CaseDecisionDag::~CaseDecisionDag(CaseDecisionDag *this)

{
  value_type_pointer puVar1;
  value_type_pointer p;
  
  puVar1 = (this->usedIndices).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           .arrays.elements_;
  if (puVar1 != (value_type_pointer)0x0) {
    operator_delete(puVar1,(this->usedIndices).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           .arrays.groups_size_mask * 0x4c + 0x58);
  }
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_void>,_std::equal_to<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                 *)&this->visitedKeys);
  std::_Optional_payload_base<slang::SVInt>::_M_reset
            ((_Optional_payload_base<slang::SVInt> *)&this->counterexample);
  p = (this->overlappingClauses).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      .arrays.elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(this->overlappingClauses).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::pair<unsigned_int,_unsigned_int>_>,_slang::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      .arrays.groups_size_mask * 0x88 + 0x90);
  }
  puVar1 = (this->unreachableClauses).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           .arrays.elements_;
  if (puVar1 != (value_type_pointer)0x0) {
    operator_delete(puVar1,(this->unreachableClauses).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_set_types<unsigned_int>,_slang::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                           .arrays.groups_size_mask * 0x4c + 0x58);
    return;
  }
  return;
}

Assistant:

class SLANG_EXPORT CaseDecisionDag {
public:
    using ClauseIndex = uint32_t;

    /// Contains the indices of clauses that are never reachable because
    /// some earlier clause subsumes it.
    flat_hash_set<ClauseIndex> unreachableClauses;

    /// Contains pairs of indices that overlap, meaning that some inputs
    /// match both clauses. Clauses that are deemed unreachable are not
    /// included here.
    flat_hash_set<std::pair<ClauseIndex, ClauseIndex>> overlappingClauses;

    /// If the DAG is not exhaustive, this contains a counterexample that
    /// demonstrates a value that is not covered by any of the clauses.
    /// Otherwise, this is empty.
    std::optional<SVInt> counterexample;

    /// If true, analyzing the case clauses took more than maxSteps and so
    /// the analysis was halted.
    bool gaveUp = false;

    /// Constructs a new case decision DAG.
    CaseDecisionDag(std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
                    uint32_t maxSteps = UINT32_MAX);

    /// Indicates whether the DAG is exhaustive, meaning that all possible
    /// input values are covered by the case statement clauses.
    bool isExhaustive() const { return !counterexample.has_value(); }

private:
    void build(uint32_t level, std::span<const SVInt> clauses, uint32_t bitWidth, bool wildcardX,
               uint32_t maxSteps, SVInt curPath, std::vector<ClauseIndex>&& activeIndices);

    uint32_t steps = 0;

    using MemoKey = std::pair<uint32_t, std::vector<ClauseIndex>>;
    flat_hash_set<MemoKey> visitedKeys;
    flat_hash_set<ClauseIndex> usedIndices;
}